

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simdnewpfor.h
# Opt level: O2

uint32_t * __thiscall
FastPForLib::SIMDNewPFor<4U,_FastPForLib::Simple16<false>_>::decodeArray
          (SIMDNewPFor<4U,_FastPForLib::Simple16<false>_> *this,uint32_t *in,size_t param_2,
          uint32_t *out,size_t *nvalue)

{
  uint32_t uVar1;
  pointer puVar2;
  uint32_t uVar3;
  NotEnoughStorage *this_00;
  ulong uVar4;
  uint *puVar5;
  uint32_t *in_00;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  uint32_t *out_00;
  size_t twonexceptions;
  
  uVar1 = *in;
  if ((ulong)(uVar1 << 7) <= *nvalue) {
    puVar5 = in + 1;
    out_00 = out;
    for (uVar3 = 0; uVar3 != uVar1; uVar3 = uVar3 + 1) {
      uVar9 = *puVar5;
      in_00 = puVar5 + 1;
      uVar7 = uVar9 >> 0x10 & 0x3ff;
      uVar6 = (ulong)uVar9 & 0xffff;
      twonexceptions = (size_t)(uVar7 * 2);
      if ((uVar9 & 0xffff) == 0) {
        uVar6 = 0;
      }
      else {
        Simple16<false>::decodeArray
                  (&this->ecoder,in_00,uVar6,
                   (this->exceptions).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start,&twonexceptions);
      }
      uVar9 = uVar9 >> 0x1a;
      usimdunpack((__m128i *)(in_00 + uVar6),out_00,uVar9);
      puVar2 = (this->exceptions).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar8 = (ulong)(uVar7 << 2);
      puVar5 = (uint *)((long)*(__m128i *)(in_00 + uVar6) + (ulong)(uVar9 << 4));
      uVar6 = 0xffffffffffffffff;
      for (uVar4 = 0; uVar8 != uVar4; uVar4 = uVar4 + 4) {
        uVar6 = (ulong)(uint)((int)uVar6 + 1 + *(int *)((long)puVar2 + uVar4));
        out_00[uVar6] = out_00[uVar6] | *(int *)((long)puVar2 + uVar4 + uVar8) + 1 << (uVar9 & 0x1f)
        ;
      }
      out_00 = out_00 + 0x80;
    }
    uVar6 = (long)out_00 - (long)out >> 2;
    if (*nvalue < uVar6) {
      fwrite("possible buffer overrun\n",0x18,1,_stderr);
    }
    *nvalue = uVar6;
    return puVar5;
  }
  this_00 = (NotEnoughStorage *)__cxa_allocate_exception(0x18);
  NotEnoughStorage::NotEnoughStorage(this_00,(ulong)*in);
  __cxa_throw(this_00,&NotEnoughStorage::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

const uint32_t *
SIMDNewPFor<BlockSizeInUnitsOfPackSize, ExceptionCoder>::decodeArray(
#ifndef NDEBUG
    const uint32_t *in, const size_t len, uint32_t *out, size_t &nvalue) {
#else
    const uint32_t *in, const size_t, uint32_t *out, size_t &nvalue) {
#endif
#ifndef NDEBUG
  const uint32_t *const initin(in);
#endif
  const uint32_t *const initout(out);

  if (BlockSize * (*in) > nvalue)
    throw NotEnoughStorage(*in);
  const uint32_t numBlocks = *in++;

  for (uint32_t i = 0; i < numBlocks; i++) {

    const uint32_t b = *in >> (32 - PFORDELTA_B);

    const size_t nExceptions =
        (*in >> (32 - (PFORDELTA_B + PFORDELTA_NEXCEPT))) &
        ((1 << PFORDELTA_NEXCEPT) - 1);

    const uint32_t encodedExceptionsSize =
        *in & ((1 << PFORDELTA_EXCEPTSZ) - 1);

    size_t twonexceptions = 2 * nExceptions;
    ++in;
    if (encodedExceptionsSize > 0)
      ecoder.decodeArray(in, encodedExceptionsSize, &exceptions[0],
                         twonexceptions);
    assert(twonexceptions >= 2 * nExceptions);
    in += encodedExceptionsSize;

    uint32_t *beginout(out); // we use this later
    usimdunpack(reinterpret_cast<const __m128i *>(in), out, b);
    in += 4 * b;
    out += 128;

    for (uint32_t e = 0, lpos = 0u-1; e < nExceptions; e++) {
      lpos += exceptions[e] + 1;
      beginout[lpos] |= (exceptions[e + nExceptions] + 1) << b;
    }
  }
  if (static_cast<size_t>(out - initout) > nvalue) {
    fprintf(stderr, "possible buffer overrun\n");
  }
  ASSERT(in <= len + initin,
      std::to_string(in - initin) + " " + std::to_string(len));

  nvalue = out - initout;
  assert(nvalue == numBlocks * BlockSize);
  return in;
}